

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bm_utils.c
# Opt level: O0

char ** mk_ascdate(void)

{
  char *pcVar1;
  int i;
  dss_time_t t;
  char **m;
  int local_44;
  char acStack_38 [48];
  char **local_8;
  
  local_8 = (char **)malloc(0x4fe8);
  if (local_8 == (char **)0x0) {
    fprintf(_stderr,"Malloc failed at %s:%d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/eyalroz[P]ssb-dbgen/src/bm_utils.c",
            0x21b);
    exit(1);
  }
  local_44 = 0;
  while( true ) {
    if (0x9fc < local_44) {
      return local_8;
    }
    pcVar1 = (char *)malloc(0xd);
    local_8[local_44] = pcVar1;
    if (local_8[local_44] == (char *)0x0) break;
    mk_time(t.year,(dss_time_t *)t._16_8_);
    strcpy(local_8[local_44],acStack_38);
    local_44 = local_44 + 1;
  }
  fprintf(_stderr,"Malloc failed at %s:%d\n",
          "/workspace/llm4binary/github/license_c_cmakelists/eyalroz[P]ssb-dbgen/src/bm_utils.c",
          0x21f);
  exit(1);
}

Assistant:

char **
mk_ascdate(void)
{
    char **m;
    dss_time_t t;
    int i;

    m = (char**) malloc((size_t)(TOTDATE * sizeof (char *)));
    MALLOC_CHECK(m);
    for (i = 0; i < TOTDATE; i++)
        {
        m[i] = (char *)malloc(DATE_LEN * sizeof(char));
        MALLOC_CHECK(m[i]);
        mk_time((long)(i + 1), &t);
        strcpy(m[i], t.alpha);
        }

    return(m);
}